

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  int in_ESI;
  long in_RDI;
  ImVec2 min_1;
  ImVec2 min;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImVec2 local_24 [2];
  ImRect local_10;
  
  if (in_ESI == 0) {
    local_10 = ImGuiWindow::Rect((ImGuiWindow *)0x16c17e);
  }
  else if (in_ESI == 1) {
    local_10 = *(ImRect *)(in_RDI + 0x208);
  }
  else if (in_ESI == 2) {
    local_10 = *(ImRect *)(in_RDI + 0x218);
  }
  else if (in_ESI == 3) {
    local_10 = *(ImRect *)(in_RDI + 0x228);
  }
  else if (in_ESI == 4) {
    local_10 = *(ImRect *)(in_RDI + 0x238);
  }
  else if (in_ESI == 5) {
    local_2c = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x16c252);
    local_24[0] = operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x16c26b);
    local_34 = operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x16c284);
    ImRect::ImRect(&local_10,local_24,&local_34);
  }
  else if (in_ESI == 6) {
    operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x16c2c2);
    local_3c = operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x16c2db);
    operator+(in_stack_ffffffffffffffa8,(ImVec2 *)0x16c2f4);
    ImRect::ImRect(&local_10,&local_3c,(ImVec2 *)&stack0xffffffffffffffb4);
  }
  else if (in_ESI == 7) {
    local_10 = *(ImRect *)(in_RDI + 0x268);
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  return local_10;
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }